

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitExpressionStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ExpressionStmt *stmt)

{
  Expr *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_58,&this->m_ident,"(Stmt::Expression ");
  pEVar1 = (stmt->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar1->_vptr_Expr[2])(&bStack_78,pEVar1,&this->field_0x8);
  std::operator+(&local_38,&local_58,&bStack_78);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitExpressionStmt(ExpressionStmt &stmt) {
        return m_ident + "(Stmt::Expression " + visitExpr(*stmt.expr) + ")";
    }